

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcReleaseDevice(RTCDevice hdevice)

{
  undefined8 *puVar1;
  allocator local_41;
  Lock<embree::MutexSys> lock;
  
  if (hdevice != (RTCDevice)0x0) {
    lock.mutex = &g_mutex;
    lock.locked = true;
    embree::MutexSys::lock(&g_mutex);
    (**(code **)(*(long *)hdevice + 0x18))(hdevice);
    embree::Lock<embree::MutexSys>::~Lock(&lock);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&lock,"invalid argument",&local_41);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),(string *)&lock);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcReleaseDevice(RTCDevice hdevice) 
  {
    Device* device = (Device*) hdevice;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcReleaseDevice);
    RTC_VERIFY_HANDLE(hdevice);
    Lock<MutexSys> lock(g_mutex);
    device->refDec();
    RTC_CATCH_END(nullptr);
  }